

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O0

void __thiscall
chrono::ChQuaternion<double>::Cross
          (ChQuaternion<double> *this,ChQuaternion<double> *qa,ChQuaternion<double> *qb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double z;
  double y;
  double x;
  double w;
  ChQuaternion<double> *qb_local;
  ChQuaternion<double> *qa_local;
  ChQuaternion<double> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = qa->m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = qb->m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -(qa->m_data[1] * qb->m_data[1]);
  auVar1 = vfmadd213sd_fma(auVar13,auVar1,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = qb->m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = -qa->m_data[2];
  auVar1 = vfmadd213sd_fma(auVar22,auVar2,auVar1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = qb->m_data[3];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -qa->m_data[3];
  auVar1 = vfmadd213sd_fma(auVar3,auVar14,auVar1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = qa->m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = qb->m_data[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = qa->m_data[1] * qb->m_data[0];
  auVar2 = vfmadd213sd_fma(auVar15,auVar4,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = qb->m_data[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = -qa->m_data[3];
  auVar2 = vfmadd213sd_fma(auVar24,auVar5,auVar2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = qa->m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = qb->m_data[3];
  auVar2 = vfmadd213sd_fma(auVar6,auVar16,auVar2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = qa->m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = qb->m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = qa->m_data[2] * qb->m_data[0];
  auVar3 = vfmadd213sd_fma(auVar17,auVar7,auVar25);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = qa->m_data[3];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = qb->m_data[1];
  auVar3 = vfmadd213sd_fma(auVar26,auVar8,auVar3);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = qb->m_data[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -qa->m_data[1];
  auVar3 = vfmadd213sd_fma(auVar9,auVar18,auVar3);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = qa->m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = qb->m_data[3];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = qa->m_data[3] * qb->m_data[0];
  auVar4 = vfmadd213sd_fma(auVar19,auVar10,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = qb->m_data[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -qa->m_data[2];
  auVar4 = vfmadd213sd_fma(auVar28,auVar11,auVar4);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = qa->m_data[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = qb->m_data[2];
  auVar4 = vfmadd213sd_fma(auVar12,auVar20,auVar4);
  this->m_data[0] = auVar1._0_8_;
  this->m_data[1] = auVar2._0_8_;
  this->m_data[2] = auVar3._0_8_;
  this->m_data[3] = auVar4._0_8_;
  return;
}

Assistant:

inline void ChQuaternion<Real>::Cross(const ChQuaternion<Real>& qa, const ChQuaternion<Real>& qb) {
    Real w = qa.m_data[0] * qb.m_data[0] - qa.m_data[1] * qb.m_data[1] - qa.m_data[2] * qb.m_data[2] -
             qa.m_data[3] * qb.m_data[3];
    Real x = qa.m_data[0] * qb.m_data[1] + qa.m_data[1] * qb.m_data[0] - qa.m_data[3] * qb.m_data[2] +
             qa.m_data[2] * qb.m_data[3];
    Real y = qa.m_data[0] * qb.m_data[2] + qa.m_data[2] * qb.m_data[0] + qa.m_data[3] * qb.m_data[1] -
             qa.m_data[1] * qb.m_data[3];
    Real z = qa.m_data[0] * qb.m_data[3] + qa.m_data[3] * qb.m_data[0] - qa.m_data[2] * qb.m_data[1] +
             qa.m_data[1] * qb.m_data[2];
    m_data[0] = w;
    m_data[1] = x;
    m_data[2] = y;
    m_data[3] = z;
}